

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_712d::StatePointer_SetState_Test::~StatePointer_SetState_Test
          (StatePointer_SetState_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StatePointer, SetState) {
	Foo foo;
	state_ptr<Foo> p{&foo, 1};
	ASSERT_EQ(p.get_ptr(), &foo);
	ASSERT_EQ(p.get_state(), 1ul);
	p.set_state(2);
	ASSERT_EQ(p.get_ptr(), &foo);
	ASSERT_EQ(p.get_state(), 2ul);
}